

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tessellation_cache.cpp
# Opt level: O1

void __thiscall embree::cache_regression_test::cache_regression_test(cache_regression_test *this)

{
  long lVar1;
  undefined1 *local_48;
  long local_40;
  undefined1 local_38 [16];
  
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"cache_regression_test","");
  (this->super_RegressionTest)._vptr_RegressionTest = (_func_int **)&PTR___cxa_pure_virtual_02202ab8
  ;
  (this->super_RegressionTest).name._M_dataplus._M_p =
       (pointer)&(this->super_RegressionTest).name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_RegressionTest).name,local_48,local_48 + local_40);
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  (this->super_RegressionTest)._vptr_RegressionTest = (_func_int **)&PTR_run_0220ecd0;
  BarrierSys::BarrierSys(&this->barrier,0);
  (this->numFailed).super___atomic_base<unsigned_long>._M_i = 0;
  (this->threadIDCounter).super___atomic_base<int>._M_i = 0;
  lVar1 = 0x48;
  do {
    *(undefined8 *)((long)this->entry + lVar1 + -0x48) = 0;
    *(undefined1 *)
     ((long)&(((cache_regression_test *)(this->entry + -4))->super_RegressionTest).
             _vptr_RegressionTest + lVar1) = 0;
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x10048);
  registerRegressionTest((RegressionTest *)0xe3ab86);
  return;
}

Assistant:

cache_regression_test() 
      : RegressionTest("cache_regression_test"), numFailed(0), threadIDCounter(0)
    {
      registerRegressionTest(this);
    }